

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O1

size_t buffer_writer_default(void **buf_addr,size_t len,void *opt)

{
  int __fd;
  void *pvVar1;
  ssize_t sVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  void *__buf;
  
  __fd = *opt;
  pvVar1 = *buf_addr;
  sVar5 = 0;
  __buf = pvVar1;
  while( true ) {
    sVar2 = write(__fd,__buf,len - sVar5);
    if (sVar2 == -1) break;
    sVar5 = sVar5 + sVar2;
    lVar4 = 0;
    if (sVar5 != len) {
      lVar4 = sVar2;
    }
    __buf = (void *)((long)__buf + lVar4);
    switch(sVar5 == len) {
    case true:
      *buf_addr = pvVar1;
      return sVar5;
    }
  }
  piVar3 = __errno_location();
  if (*piVar3 == 4) {
    *piVar3 = 0;
    sVar5 = (*(code *)0x127258)();
    return sVar5;
  }
  *buf_addr = (void *)0x0;
  sVar5 = (*(code *)&LAB_001272cf)();
  return sVar5;
}

Assistant:

static size_t buffer_writer_default(const void **buf_addr, size_t len,
				    void *opt)
{
  struct profile_ctx *ctx = opt;
  const int fd = ctx->fd;
  const void * const buf_start = *buf_addr;
  const void *data = *buf_addr;
  size_t write_total = 0;

  lj_assertX(len <= STREAM_BUFFER_SIZE, "stream buffer overflow");

  for (;;) {
    const ssize_t written = write(fd, data, len - write_total);

    if (LJ_UNLIKELY(written == -1)) {
      /* Re-tries write in case of EINTR. */
      if (errno != EINTR) {
  /* Will be freed as whole chunk later. */
  *buf_addr = NULL;
  return write_total;
      }

      errno = 0;
      continue;
    }

    write_total += written;
    lj_assertX(write_total <= len, "invalid stream buffer write");

    if (write_total == len)
      break;

    data = (uint8_t *)data + (ptrdiff_t)written;
  }

  *buf_addr = buf_start;
  return write_total;
}